

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_list.cpp
# Opt level: O2

void __thiscall ImageList::drawRow(ImageList *this,QPainter *painter,QRect *rect,int row)

{
  int iVar1;
  int iVar2;
  int iVar3;
  AbstractScrollArea *pAVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QPalette *pQVar9;
  QColor *pQVar10;
  QImage *image;
  int iVar11;
  QColor QVar12;
  QRect r;
  QColor border;
  QColor background;
  QRect local_98;
  QLinearGradient g;
  
  pQVar9 = (QPalette *)QWidget::palette();
  pQVar10 = QPalette::color(pQVar9,Button);
  background._0_8_ = *(undefined8 *)pQVar10;
  background._8_8_ = *(undefined8 *)((long)&pQVar10->ct + 4);
  border._0_8_ = 0;
  border._8_8_ = 0;
  r.x1 = 0;
  r.y1 = 0x3ff00000;
  r.x2 = 0;
  r.y2 = 0;
  QLinearGradient::QLinearGradient(&g,(QPointF *)&border,(QPointF *)&r);
  QGradient::setCoordinateMode((CoordinateMode)&g);
  QGradient::setColorAt(0.0,(QColor *)&g);
  QVar12 = QtMWidgets::lighterColor(&background,0x4b);
  border._0_8_ = QVar12._0_8_;
  border.ct._4_6_ = QVar12.ct._4_6_;
  QGradient::setColorAt(1.0,(QColor *)&g);
  pQVar9 = (QPalette *)QWidget::palette();
  pQVar10 = QPalette::color(pQVar9,Dark);
  border._0_8_ = *(undefined8 *)pQVar10;
  border._8_8_ = *(undefined8 *)((long)&pQVar10->ct + 4);
  QPainter::setPen((QColor *)painter);
  QBrush::QBrush((QBrush *)&r,(QGradient *)&g);
  QPainter::setBrush((QBrush *)painter);
  QBrush::~QBrush((QBrush *)&r);
  pAVar4 = (this->super_AbstractListView<QImage>).super_AbstractListViewBase.
           super_AbstractScrollArea.d.d[1].q;
  image = (QImage *)(**(code **)(*(long *)pAVar4 + 0x60))(pAVar4,row);
  iVar11 = rect->x1;
  iVar1 = rect->x2;
  iVar6 = QImage::width();
  iVar2 = rect->y1;
  iVar7 = QImage::width();
  iVar3 = ((this->d).d)->borderWidth;
  iVar8 = QImage::height();
  iVar11 = ((iVar1 - (iVar6 + iVar11)) + 1) / 2 + iVar11;
  r.x2 = iVar7 + iVar11 + iVar3 * 2 + -1;
  r.y2 = iVar8 + iVar2 + ((this->d).d)->borderWidth * 2 + -1;
  r.x1 = iVar11;
  r.y1 = iVar2;
  QPainter::drawRect(painter,&r);
  iVar1 = ((this->d).d)->borderWidth;
  local_98.x1 = r.x1 + iVar1 + -1;
  local_98.x2 = r.x2 - iVar1;
  local_98.y1 = iVar1 + -1 + r.y1;
  local_98.y2 = r.y2 - iVar1;
  QPainter::drawRect(painter,&local_98);
  cVar5 = QImage::isNull();
  if (cVar5 == '\0') {
    iVar1 = ((this->d).d)->borderWidth;
    local_98.y1 = iVar2 + iVar1;
    local_98.x1 = iVar11 + iVar1;
    QPainter::drawImage(painter,(QPoint *)&local_98,image);
  }
  QLinearGradient::~QLinearGradient(&g);
  return;
}

Assistant:

void
ImageList::drawRow( QPainter * painter,
	const QRect & rect, int row )
{
	QColor background = palette().color( QPalette::Button );

	QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 1.0, 0.0 ) );
	g.setCoordinateMode( QGradient::ObjectBoundingMode );
	g.setColorAt( 0.0, background );
	g.setColorAt( 1.0, QtMWidgets::lighterColor( background, 75 ) );

	QColor border = palette().color( QPalette::Dark );

	painter->setPen( border );
	painter->setBrush( g );

	const QImage & image = model()->data( row );

	const int x = rect.x() + ( rect.width() - image.width() ) / 2;
	const int y = rect.y();

	const QRect r( x, y,
		image.width() + 2 * d->borderWidth,
		image.height() + 2 * d->borderWidth );

	painter->drawRect( r );
	painter->drawRect( r.adjusted( d->borderWidth - 1, d->borderWidth - 1,
		- d->borderWidth, - d->borderWidth ) );

	if( !image.isNull() )
		painter->drawImage( QPoint( x + d->borderWidth, y + d->borderWidth ),
			image );
}